

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fTessellationTests.cpp
# Opt level: O3

vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
* __thiscall
deqp::gles31::Functional::anon_unknown_1::PrimitiveSetInvarianceCase::genTessLevelCases
          (vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
           *__return_storage_ptr__,PrimitiveSetInvarianceCase *this)

{
  undefined8 uVar1;
  bool bVar2;
  int i;
  int iVar3;
  float *pfVar4;
  bool bVar5;
  long lVar6;
  float fVar7;
  TessLevels levels;
  Random rnd;
  value_type local_78;
  undefined8 local_58;
  undefined8 uStack_50;
  undefined8 local_48;
  deRandom local_40;
  
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (__return_storage_ptr__->
  super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
  )._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  lVar6 = 0;
  do {
    local_78.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
    local_78.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.levels.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    *(undefined8 *)
     ((local_78.levels.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
       ._M_impl.super__Vector_impl_data._M_start)->outer + 2) =
         *(undefined8 *)((long)genTessLevelCases::basicTessLevelCases[0].outer + lVar6 + 8);
    uVar1 = *(undefined8 *)((long)genTessLevelCases::basicTessLevelCases[0].outer + lVar6);
    *(undefined8 *)
     (local_78.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start)->inner =
         *(undefined8 *)((long)genTessLevelCases::basicTessLevelCases[0].inner + lVar6);
    *(undefined8 *)
     (local_78.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start)->outer = uVar1;
    local_78.mem = 0;
    local_78.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.levels.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
    ::push_back(__return_storage_ptr__,&local_78);
    if (local_78.levels.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.levels.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.levels.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.levels.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    lVar6 = lVar6 + 0x18;
  } while (lVar6 != 0xd8);
  deRandom_init(&local_40,0x7b);
  iVar3 = 0;
  do {
    pfVar4 = (float *)&local_58;
    bVar2 = true;
    do {
      bVar5 = bVar2;
      fVar7 = deRandom_getFloat(&local_40);
      *pfVar4 = fVar7 * 15.0 + 1.0;
      pfVar4 = (float *)((long)&local_58 + 4);
      bVar2 = false;
    } while (bVar5);
    lVar6 = 2;
    do {
      fVar7 = deRandom_getFloat(&local_40);
      *(float *)((long)&local_58 + lVar6 * 4) = fVar7 * 15.0 + 1.0;
      lVar6 = lVar6 + 1;
    } while (lVar6 != 6);
    local_78.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)operator_new(0x18);
    local_78.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_finish =
         local_78.levels.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_start + 1;
    *(undefined8 *)
     ((local_78.levels.
       super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
       ._M_impl.super__Vector_impl_data._M_start)->outer + 2) = local_48;
    *(undefined8 *)
     (local_78.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start)->inner = local_58;
    *(undefined8 *)
     (local_78.levels.
      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
      ._M_impl.super__Vector_impl_data._M_start)->outer = uStack_50;
    local_78.mem = 0;
    local_78.levels.
    super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage =
         local_78.levels.
         super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
         ._M_impl.super__Vector_impl_data._M_finish;
    std::
    vector<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::LevelCase>_>
    ::push_back(__return_storage_ptr__,&local_78);
    if (local_78.levels.
        super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
        ._M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_78.levels.
                      super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_78.levels.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_78.levels.
                            super__Vector_base<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels,_std::allocator<deqp::gles31::Functional::(anonymous_namespace)::PrimitiveSetInvarianceCase::TessLevels>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    iVar3 = iVar3 + 1;
  } while (iVar3 != 10);
  return __return_storage_ptr__;
}

Assistant:

static string elemsStr (const IterT& begin, const IterT& end, int wrapLengthParam = 0, int numIndentationSpaces = 0)
{
	const string	baseIndentation	= string(numIndentationSpaces, ' ');
	const string	deepIndentation	= baseIndentation + string(4, ' ');
	const int		wrapLength		= wrapLengthParam > 0 ? wrapLengthParam : std::numeric_limits<int>::max();
	const int		length			= (int)std::distance(begin, end);
	string			result;

	if (length > wrapLength)
		result += "(amount: " + de::toString(length) + ") ";
	result += string() + "{" + (length > wrapLength ? "\n"+deepIndentation : " ");

	{
		int index = 0;
		for (IterT it = begin; it != end; ++it)
		{
			if (it != begin)
				result += string() + ", " + (index % wrapLength == 0 ? "\n"+deepIndentation : "");
			result += de::toString(*it);
			index++;
		}

		result += length > wrapLength ? "\n"+baseIndentation : " ";
	}

	result += "}";
	return result;
}